

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

LY_ERR moveto_op_comp_item(lyxp_set *set1,uint32_t idx1,lyxp_set *set2,char *op,
                          ly_bool switch_operands,ly_bool *result)

{
  lys_module *plVar1;
  ly_ctx *plVar2;
  LY_ERR LVar3;
  int iVar4;
  lysc_node **pplVar5;
  size_t sVar6;
  char *pcVar7;
  lyxp_set_type type;
  lyxp_set *set2_00;
  lyxp_set *set1_00;
  lysc_node *plVar8;
  lyxp_set_node *plVar9;
  void *local_f8;
  lyd_value val;
  lyxp_set tmp1;
  
  memset(&tmp1,0,0x90);
  if (set1->type != LYXP_SET_NODE_SET) {
    __assert_fail("set1->type == LYXP_SET_NODE_SET",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c",
                  0x1c5c,
                  "LY_ERR moveto_op_comp_item(const struct lyxp_set *, uint32_t, struct lyxp_set *, const char *, ly_bool, ly_bool *)"
                 );
  }
  type = (uint)(set2->type != LYXP_SET_BOOLEAN) * 2 + LYXP_SET_BOOLEAN;
  if (set2->type == LYXP_SET_NUMBER) {
    type = LYXP_SET_NUMBER;
  }
  LVar3 = set_comp_cast(&tmp1,set1,type,idx1);
  if (LVar3 != LY_SUCCESS) goto LAB_001adcf0;
  plVar9 = (set1->val).nodes + idx1;
  local_f8 = (void *)0x0;
  if (set2->type == LYXP_SET_STRING) {
    if (plVar9->type != LYXP_NODE_META) {
      if (plVar9->type == LYXP_NODE_ELEM) {
        plVar8 = plVar9->node->schema;
        if ((plVar8 != (lysc_node *)0x0) && ((plVar8->nodetype & 0xc) != 0)) {
          pplVar5 = &plVar9->node[1].schema;
          goto LAB_001adba7;
        }
      }
      goto LAB_001adbac;
    }
    pplVar5 = (lysc_node **)&plVar9->node->meta;
LAB_001adba7:
    plVar8 = *pplVar5;
  }
  else {
LAB_001adbac:
    plVar8 = (lysc_node *)0x0;
  }
  if (plVar8 != (lysc_node *)0x0) {
    iVar4 = *(int *)&plVar8->next;
    if (iVar4 == 0xb) {
      if (plVar8->parent->module != (lys_module *)lyplg_type_store_enum) goto LAB_001adc1d;
    }
    else if (iVar4 == 8) {
      if (plVar8->parent->module != (lys_module *)lyplg_type_store_boolean) goto LAB_001adc1d;
    }
    else if ((iVar4 != 6) || (plVar8->parent->module != (lys_module *)lyplg_type_store_string)) {
LAB_001adc1d:
      plVar1 = plVar8->parent->module;
      pcVar7 = (set2->val).str;
      plVar2 = set2->ctx;
      sVar6 = strlen(pcVar7);
      iVar4 = (*(code *)plVar1)(plVar2,plVar8,pcVar7,sVar6,0,set2->format,set2->prefix_data,0x3f3,
                                plVar9->node->schema,&val,0,&local_f8);
      ly_err_free(local_f8);
      if ((iVar4 == 9) || (iVar4 == 0)) {
        free((set2->val).nodes);
        pcVar7 = lyd_value_get_canonical(set2->ctx,&val);
        pcVar7 = strdup(pcVar7);
        (set2->val).str = pcVar7;
        (*(code *)plVar8->parent->ref)(set2->ctx);
        if ((set2->val).nodes == (lyxp_set_node *)0x0) {
          LVar3 = LY_EMEM;
          ly_log(set2->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","set_comp_canonize");
          goto LAB_001adcf0;
        }
      }
    }
  }
  if (switch_operands == '\0') {
    set1_00 = &tmp1;
    set2_00 = set2;
  }
  else {
    set2_00 = &tmp1;
    set1_00 = set2;
  }
  LVar3 = moveto_op_comp(set1_00,set2_00,op,result);
LAB_001adcf0:
  lyxp_set_free_content(&tmp1);
  return LVar3;
}

Assistant:

static LY_ERR
moveto_op_comp_item(const struct lyxp_set *set1, uint32_t idx1, struct lyxp_set *set2, const char *op,
        ly_bool switch_operands, ly_bool *result)
{
    struct lyxp_set tmp1 = {0};
    LY_ERR rc = LY_SUCCESS;

    assert(set1->type == LYXP_SET_NODE_SET);

    /* cast set1 */
    switch (set2->type) {
    case LYXP_SET_NUMBER:
        rc = set_comp_cast(&tmp1, set1, LYXP_SET_NUMBER, idx1);
        break;
    case LYXP_SET_BOOLEAN:
        rc = set_comp_cast(&tmp1, set1, LYXP_SET_BOOLEAN, idx1);
        break;
    default:
        rc = set_comp_cast(&tmp1, set1, LYXP_SET_STRING, idx1);
        break;
    }
    LY_CHECK_GOTO(rc, cleanup);

    /* canonize set2 */
    LY_CHECK_GOTO(rc = set_comp_canonize(set2, &set1->val.nodes[idx1]), cleanup);

    /* compare recursively and store the result */
    if (switch_operands) {
        LY_CHECK_GOTO(rc = moveto_op_comp(set2, &tmp1, op, result), cleanup);
    } else {
        LY_CHECK_GOTO(rc = moveto_op_comp(&tmp1, set2, op, result), cleanup);
    }

cleanup:
    lyxp_set_free_content(&tmp1);
    return rc;
}